

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hpp
# Opt level: O0

Op * __thiscall
xercesc_4_0::RegularExpression::compileClosure
          (RegularExpression *this,Token *token,Op *next,bool reverse,tokType tkType)

{
  uint id;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ChildOp *this_01;
  Op *pOVar3;
  XMLSize_t XVar4;
  opType type;
  int local_64;
  ChildOp *pCStack_60;
  int i_2;
  ChildOp *childOp_1;
  ChildOp *childOp;
  int i_1;
  int i;
  int max;
  int min;
  Token *childTok;
  Op *ret;
  tokType tkType_local;
  bool reverse_local;
  Op *next_local;
  Token *token_local;
  RegularExpression *this_local;
  Token *this_00;
  
  iVar2 = (*token->_vptr_Token[2])(token,0);
  this_00 = (Token *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*token->_vptr_Token[4])();
  i_1 = (*token->_vptr_Token[5])();
  if ((iVar2 < 0) || (iVar2 != i_1)) {
    if ((0 < iVar2) && (0 < i_1)) {
      i_1 = i_1 - iVar2;
    }
    if (i_1 < 1) {
      if (tkType == T_NONGREEDYCLOSURE) {
        pCStack_60 = OpFactory::createNonGreedyClosureOp(&this->fOpFactory);
      }
      else {
        XVar4 = Token::getMinLength(this_00);
        if (XVar4 == 0) {
          id = this->fNoClosures;
          this->fNoClosures = id + 1;
          pCStack_60 = OpFactory::createClosureOp(&this->fOpFactory,id);
        }
        else {
          pCStack_60 = OpFactory::createClosureOp(&this->fOpFactory,-1);
        }
      }
      Op::setNextOp(&pCStack_60->super_Op,next);
      if ((next == (Op *)0x0) || (bVar1 = doTokenOverlap(this,next,this_00), !bVar1)) {
        type = O_FINITE_CLOSURE;
        if (tkType == T_NONGREEDYCLOSURE) {
          type = O_FINITE_NONGREEDYCLOSURE;
        }
        Op::setOpType(&pCStack_60->super_Op,type);
        pOVar3 = compile(this,this_00,(Op *)0x0,reverse);
        ChildOp::setChild(pCStack_60,pOVar3);
      }
      else {
        pOVar3 = compile(this,this_00,&pCStack_60->super_Op,reverse);
        ChildOp::setChild(pCStack_60,pOVar3);
      }
      childTok = (Token *)pCStack_60;
    }
    else {
      childTok = (Token *)next;
      for (childOp._0_4_ = 0; (int)childOp < i_1; childOp._0_4_ = (int)childOp + 1) {
        this_01 = OpFactory::createQuestionOp(&this->fOpFactory,tkType == T_NONGREEDYCLOSURE);
        Op::setNextOp(&this_01->super_Op,next);
        pOVar3 = compile(this,this_00,(Op *)childTok,reverse);
        ChildOp::setChild(this_01,pOVar3);
        childTok = (Token *)this_01;
      }
    }
    if (0 < iVar2) {
      for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
        childTok = (Token *)compile(this,this_00,(Op *)childTok,reverse);
      }
    }
    this_local = (RegularExpression *)childTok;
  }
  else {
    childTok = (Token *)next;
    for (childOp._4_4_ = 0; childOp._4_4_ < iVar2; childOp._4_4_ = childOp._4_4_ + 1) {
      childTok = (Token *)compile(this,this_00,(Op *)childTok,reverse);
    }
    this_local = (RegularExpression *)childTok;
  }
  return (Op *)this_local;
}

Assistant:

inline Op* RegularExpression::compileClosure(const Token* const token,
                                               Op* const next,
                                               const bool reverse,
                                               const Token::tokType tkType) {

      Op*    ret      = 0;
      Token* childTok = token->getChild(0);
      int    min      = token->getMin();
      int    max      = token->getMax();

      if (min >= 0 && min == max) {

          ret = next;
          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }

          return ret;
      }

      if (min > 0 && max > 0)
          max -= min;

      if (max > 0) {

          ret = next;
          for (int i=0; i<max; i++) {

              ChildOp* childOp = fOpFactory.createQuestionOp(
                  tkType == Token::T_NONGREEDYCLOSURE);

              childOp->setNextOp(next);
              childOp->setChild(compile(childTok, ret, reverse));
              ret = childOp;
          }
      }
      else {

          ChildOp* childOp = 0;

          if (tkType == Token::T_NONGREEDYCLOSURE) {
              childOp = fOpFactory.createNonGreedyClosureOp();
          }
          else {

              if (childTok->getMinLength() == 0)
                  childOp = fOpFactory.createClosureOp(fNoClosures++);
              else
                  childOp = fOpFactory.createClosureOp(-1);
          }

          childOp->setNextOp(next);
          if(next==NULL || !doTokenOverlap(next, childTok))
          {
              childOp->setOpType(tkType == Token::T_NONGREEDYCLOSURE?Op::O_FINITE_NONGREEDYCLOSURE:Op::O_FINITE_CLOSURE);
              childOp->setChild(compile(childTok, NULL, reverse));
          }
          else
          {
              childOp->setChild(compile(childTok, childOp, reverse));
          }
          ret = childOp;
      }

      if (min > 0) {

          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }
      }

      return ret;
  }